

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flecs.hpp
# Opt level: O0

size_t flecs::_::component_info<EcsType>::size(void)

{
  _ecs_assert(s_id != 0,0xc,(char *)0x0,"s_id != 0",
              "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O0/flecs-clone-prefix/src/flecs-clone/include/flecs/flecs.hpp"
              ,0xe4a);
  if (s_id != 0) {
    return 0x10;
  }
  __assert_fail("s_id != 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O0/flecs-clone-prefix/src/flecs-clone/include/flecs/flecs.hpp"
                ,0xe4a,"static size_t flecs::_::component_info<EcsType>::size() [T = EcsType]");
}

Assistant:

static size_t size() {
        ecs_assert(s_id != 0, ECS_INTERNAL_ERROR, NULL);
        
        // C++ types that have no members still have a size. Use std::is_empty
        // to check if the type is empty. If so, use 0 for the component size.
        //
        // If s_allow_tag is set to false, the size returned by C++ is used.
        // This is useful in cases where class instances are still required, as
        // is the case with module classes.
        if (s_allow_tag && std::is_empty<T>::value) {
            return 0;
        } else {
            return sizeof(typename std::remove_pointer<T>::type);
        }
    }